

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O0

void __thiscall
picojson::
input<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::skip_ws(input<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *this)

{
  int iVar1;
  FILE *__stream;
  int in_ESI;
  undefined4 in_register_00000034;
  int ch;
  input<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_local;
  
  do {
    do {
      iVar1 = getc(this,(FILE *)CONCAT44(in_register_00000034,in_ESI));
    } while (iVar1 == 0x20);
  } while (((iVar1 == 9) || (iVar1 == 10)) || (iVar1 == 0xd));
  ungetc(this,in_ESI,__stream);
  return;
}

Assistant:

void skip_ws() {
      while (1) {
	int ch = getc();
	if (! (ch == ' ' || ch == '\t' || ch == '\n' || ch == '\r')) {
	  ungetc();
	  break;
	}
      }
    }